

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

void Abc_NtkDfsReverse_rec(Abc_Obj_t *pNode,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  int iVar6;
  long lVar7;
  
  if ((*(uint *)&pNode->field_0x14 & 0xf) == 6) {
    __assert_fail("!Abc_ObjIsNet(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,0xbf,"void Abc_NtkDfsReverse_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar2 = pNode->pNtk;
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar6] == iVar1) {
    return;
  }
  iVar6 = pNode->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
  if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar6] = iVar1;
  uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
  if (0xfffffffd < uVar4 - 5) {
    return;
  }
  if (uVar4 != 7) {
    __assert_fail("Abc_ObjIsNode( pNode )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcDfs.c"
                  ,200,"void Abc_NtkDfsReverse_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if (pNode->pNtk->ntkType == ABC_NTK_NETLIST) {
    pNode = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray];
  }
  if (0 < (pNode->vFanouts).nSize) {
    lVar7 = 0;
    do {
      Abc_NtkDfsReverse_rec
                ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar7]],vNodes);
      lVar7 = lVar7 + 1;
    } while (lVar7 < (pNode->vFanouts).nSize);
  }
  uVar4 = vNodes->nCap;
  if (vNodes->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar4 * 2;
      if (iVar6 <= (int)uVar4) goto LAB_00838fd5;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar4 << 4);
      }
      vNodes->pArray = ppvVar5;
    }
    vNodes->nCap = iVar6;
  }
LAB_00838fd5:
  iVar6 = vNodes->nSize;
  vNodes->nSize = iVar6 + 1;
  vNodes->pArray[iVar6] = pNode;
  return;
}

Assistant:

void Abc_NtkDfsReverse_rec( Abc_Obj_t * pNode, Vec_Ptr_t * vNodes )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( !Abc_ObjIsNet(pNode) );
    // if this node is already visited, skip
    if ( Abc_NodeIsTravIdCurrent( pNode ) )
        return;
    // mark the node as visited
    Abc_NodeSetTravIdCurrent( pNode );
    // skip the CI
    if ( Abc_ObjIsCo(pNode) )
        return;
    assert( Abc_ObjIsNode( pNode ) );
    // visit the transitive fanin of the node
    pNode = Abc_ObjFanout0Ntk(pNode);
    Abc_ObjForEachFanout( pNode, pFanout, i )
        Abc_NtkDfsReverse_rec( pFanout, vNodes );
    // add the node after the fanins have been added
    Vec_PtrPush( vNodes, pNode );
}